

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList
               (ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar7;
  undefined4 uVar8;
  ImVec2 IVar6;
  undefined4 uVar9;
  undefined4 uVar10;
  ImGuiWindow *pIVar11;
  ImDrawVert *pIVar12;
  ImDrawList *this;
  undefined1 auVar13 [16];
  bool bVar14;
  bool bVar15;
  char cVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  ImGuiWindow *window_1;
  int n_1;
  char *pcVar20;
  ulong uVar21;
  unsigned_short *puVar22;
  long lVar23;
  uint uVar24;
  ImGuiContext *g;
  ImGuiContext *pIVar25;
  ImVec4 *buf_00;
  ImDrawCmd *pIVar26;
  undefined4 uVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  ImGuiListClipper clipper;
  ImVec2 triangle_2 [3];
  char buf [300];
  ImGuiListClipper local_1e8;
  ulong local_1d0;
  ImDrawList *local_1c8;
  ulong local_1c0;
  ImVec2 local_1b8 [4];
  undefined1 local_198 [24];
  ImDrawCmd *local_180;
  ImGuiContext *local_178;
  ImVec2 local_170;
  ImVec4 local_168 [18];
  undefined1 local_3c [12];
  
  pcVar20 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar20 = draw_list->_OwnerName;
  }
  bVar14 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds","DrawList",pcVar20,
                    (ulong)(uint)(draw_list->VtxBuffer).Size,
                    (ulong)(uint)(draw_list->IdxBuffer).Size,(draw_list->CmdBuffer).Size);
  pIVar25 = GImGui;
  pIVar11 = GImGui->CurrentWindow;
  pIVar11->WriteAccessed = true;
  if (pIVar11->DrawList == draw_list) {
    if (pIVar11->SkipItems == false) {
      (pIVar11->DC).CursorPos.x = (pIVar25->Style).ItemSpacing.x + (pIVar11->DC).CursorPosPrevLine.x
      ;
      (pIVar11->DC).CursorPos.y = (pIVar11->DC).CursorPosPrevLine.y;
      (pIVar11->DC).CurrLineSize = (pIVar11->DC).PrevLineSize;
      (pIVar11->DC).CurrLineTextBaseOffset = (pIVar11->DC).PrevLineTextBaseOffset;
    }
    local_168[0].x = 1.0;
    local_168[0].y = 0.4;
    local_168[0].z = 0.4;
    local_168[0].w = 1.0;
    TextColored(local_168,"CURRENTLY APPENDING");
    if (!bVar14) {
      return;
    }
  }
  else {
    local_1c8 = &pIVar25->ForegroundDrawList;
    if (window == (ImGuiWindow *)0x0) {
      if (!bVar14) {
        return;
      }
    }
    else {
      bVar15 = IsItemHovered(0);
      if (bVar15) {
        local_168[0].y = (window->Size).y + (window->Pos).y;
        local_168[0].x = (window->Size).x + (window->Pos).x;
        ImDrawList::AddRect(local_1c8,&window->Pos,(ImVec2 *)local_168,0xff00ffff,0.0,0xf,1.0);
      }
      if (!bVar14) {
        return;
      }
      if (window->WasActive == false) {
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
      }
    }
    if (0 < (draw_list->CmdBuffer).Size) {
      pIVar26 = (draw_list->CmdBuffer).Data;
      uVar21 = 0;
      local_178 = pIVar25;
      do {
        if (pIVar26->UserCallback == (ImDrawCallback)0x0) {
          if (pIVar26->ElemCount != 0) {
            if ((draw_list->IdxBuffer).Size < 1) {
              puVar22 = (unsigned_short *)0x0;
            }
            else {
              puVar22 = (draw_list->IdxBuffer).Data;
            }
            local_1d0 = uVar21;
            ImFormatString((char *)local_168,300,
                           "DrawCmd: %4d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                           SUB84((double)(pIVar26->ClipRect).x,0),
                           SUB84((double)(pIVar26->ClipRect).y,0),(double)(pIVar26->ClipRect).z,
                           SUB84((double)(pIVar26->ClipRect).w,0),(ulong)pIVar26->ElemCount / 3,
                           pIVar26->TextureId);
            cVar16 = TreeNode((void *)(((long)pIVar26 - (long)(draw_list->CmdBuffer).Data >> 3) *
                                      0x6db6db6db6db6db7),"%s",local_168);
            if ((show_drawcmd_details == true) &&
               (bVar14 = IsItemHovered(0), this = local_1c8, bVar14)) {
              local_1c0 = CONCAT71(local_1c0._1_7_,cVar16);
              uVar2 = (pIVar26->ClipRect).x;
              uVar7 = (pIVar26->ClipRect).y;
              uVar3 = (pIVar26->ClipRect).z;
              uVar8 = (pIVar26->ClipRect).w;
              uVar17 = pIVar26->ElemCount;
              if ((uint)local_1d0 < uVar17 + (uint)local_1d0) {
                uVar21 = local_1d0 & 0xffffffff;
                fVar28 = 3.4028235e+38;
                fVar29 = 3.4028235e+38;
                fVar30 = -3.4028235e+38;
                fVar31 = -3.4028235e+38;
                do {
                  if (puVar22 == (unsigned_short *)0x0) {
                    uVar18 = (uint)uVar21;
                  }
                  else {
                    uVar18 = (uint)puVar22[uVar21];
                  }
                  if ((draw_list->VtxBuffer).Size <= (int)uVar18) {
LAB_001e858f:
                    __assert_fail("i < Size",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                                  ,0x503,"T &ImVector<ImDrawVert>::operator[](int) [T = ImDrawVert]"
                                 );
                  }
                  IVar6 = (draw_list->VtxBuffer).Data[(int)uVar18].pos;
                  fVar32 = IVar6.x;
                  fVar33 = IVar6.y;
                  fVar28 = (float)(~-(uint)(fVar32 < fVar28) & (uint)fVar28 |
                                  (uint)fVar32 & -(uint)(fVar32 < fVar28));
                  fVar29 = (float)(~-(uint)(fVar33 < fVar29) & (uint)fVar29 |
                                  (uint)fVar33 & -(uint)(fVar33 < fVar29));
                  fVar30 = (float)(~-(uint)(fVar30 < fVar32) & (uint)fVar30 |
                                  (uint)fVar32 & -(uint)(fVar30 < fVar32));
                  fVar31 = (float)(~-(uint)(fVar31 < fVar33) & (uint)fVar31 |
                                  (uint)fVar33 & -(uint)(fVar31 < fVar33));
                  uVar21 = uVar21 + 1;
                  uVar17 = uVar17 - 1;
                } while (uVar17 != 0);
                local_198._0_4_ = (undefined4)(int)fVar28;
                local_198._4_4_ = (undefined4)(int)fVar29;
                local_198._8_4_ = (undefined4)(int)fVar30;
                local_198._12_4_ = (undefined4)(int)fVar31;
              }
              local_1e8.DisplayEnd = (int)(float)(int)(float)uVar7;
              local_1e8.DisplayStart = (int)(float)(int)(float)uVar2;
              local_1b8[0].y = (float)(int)(float)uVar8;
              local_1b8[0].x = (float)(int)(float)uVar3;
              ImDrawList::AddRect(local_1c8,(ImVec2 *)&local_1e8,local_1b8,0xffff00ff,0.0,0xf,1.0);
              auVar13 = local_198._0_16_;
              local_1e8.DisplayStart = local_198._0_4_;
              local_1e8.DisplayEnd = local_198._4_4_;
              local_1b8[0].x = (float)local_198._8_4_;
              local_1b8[0].y = (float)local_198._12_4_;
              local_198._0_16_ = auVar13;
              ImDrawList::AddRect(this,(ImVec2 *)&local_1e8,local_1b8,0xff00ffff,0.0,0xf,1.0);
              cVar16 = (char)local_1c0;
            }
            uVar21 = local_1d0;
            if (cVar16 != '\0') {
              uVar17 = pIVar26->ElemCount;
              uVar18 = uVar17 + (uint)local_1d0;
              uVar27 = 0;
              if ((uint)local_1d0 < uVar18) {
                iVar19 = (draw_list->VtxBuffer).Size;
                uVar21 = local_1d0 & 0xffffffff;
                fVar28 = 0.0;
                do {
                  local_1e8.DisplayStart = 0;
                  local_1e8.DisplayEnd = 0;
                  local_1e8.ItemsCount = 0;
                  local_1e8.StepNo = 0;
                  local_1e8.ItemsHeight = 0.0;
                  local_1e8.StartPosY = 0.0;
                  lVar23 = 0;
                  do {
                    uVar24 = (uint)(uVar21 + lVar23);
                    if (puVar22 != (unsigned_short *)0x0) {
                      uVar24 = (uint)puVar22[uVar21 + lVar23 & 0xffffffff];
                    }
                    if (iVar19 <= (int)uVar24) goto LAB_001e858f;
                    *(ImVec2 *)(&local_1e8.DisplayStart + lVar23 * 2) =
                         (draw_list->VtxBuffer).Data[(int)uVar24].pos;
                    lVar23 = lVar23 + 1;
                  } while (lVar23 != 3);
                  fVar28 = fVar28 + ABS(((float)local_1e8.DisplayEnd - (float)local_1e8.StepNo) *
                                        local_1e8.ItemsHeight +
                                        ((float)local_1e8.StepNo - local_1e8.StartPosY) *
                                        (float)local_1e8.DisplayStart +
                                        (local_1e8.StartPosY - (float)local_1e8.DisplayEnd) *
                                        (float)local_1e8.ItemsCount) * 0.5;
                  uVar21 = uVar21 + 3;
                } while ((uint)uVar21 < uVar18);
                uVar27 = SUB84((double)fVar28,0);
              }
              ImFormatString((char *)local_168,300,
                             "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                             uVar27,(ulong)uVar17,(ulong)pIVar26->VtxOffset,
                             (ulong)pIVar26->IdxOffset);
              local_1e8.DisplayStart = 0;
              local_1e8.DisplayEnd = 0;
              Selectable((char *)local_168,false,0,(ImVec2 *)&local_1e8);
              bVar14 = IsItemHovered(0);
              if ((bVar14) && (show_drawcmd_details == true)) {
                uVar17 = (pIVar25->ForegroundDrawList).Flags;
                (pIVar25->ForegroundDrawList).Flags = uVar17 & 0xfffffffe;
                uVar4 = (pIVar26->ClipRect).x;
                uVar9 = (pIVar26->ClipRect).y;
                local_1e8.DisplayEnd = (int)(float)(int)(float)uVar9;
                local_1e8.DisplayStart = (int)(float)(int)(float)uVar4;
                uVar5 = (pIVar26->ClipRect).z;
                uVar10 = (pIVar26->ClipRect).w;
                local_1b8[0].y = (float)(int)(float)uVar10;
                local_1b8[0].x = (float)(int)(float)uVar5;
                ImDrawList::AddRect(local_1c8,(ImVec2 *)&local_1e8,local_1b8,0xffff00ff,0.0,0xf,1.0)
                ;
                if ((uint)local_1d0 < pIVar26->ElemCount + (uint)local_1d0) {
                  uVar21 = local_1d0 & 0xffffffff;
                  do {
                    local_1e8.DisplayStart = 0;
                    local_1e8.DisplayEnd = 0;
                    local_1e8.ItemsCount = 0;
                    local_1e8.StepNo = 0;
                    local_1e8.ItemsHeight = 0.0;
                    local_1e8.StartPosY = 0.0;
                    iVar19 = (draw_list->VtxBuffer).Size;
                    lVar23 = 0;
                    do {
                      uVar18 = (uint)(uVar21 + lVar23);
                      if (puVar22 != (unsigned_short *)0x0) {
                        uVar18 = (uint)puVar22[uVar21 + lVar23 & 0xffffffff];
                      }
                      if (iVar19 <= (int)uVar18) goto LAB_001e858f;
                      *(ImVec2 *)(&local_1e8.DisplayStart + lVar23 * 2) =
                           (draw_list->VtxBuffer).Data[(int)uVar18].pos;
                      lVar23 = lVar23 + 1;
                    } while (lVar23 != 3);
                    ImDrawList::AddPolyline(local_1c8,(ImVec2 *)&local_1e8,3,0xff00ffff,true,1.0);
                    uVar21 = uVar21 + 3;
                  } while ((uint)uVar21 < pIVar26->ElemCount + (int)local_1d0);
                }
                (pIVar25->ForegroundDrawList).Flags = uVar17;
              }
              local_1e8.StartPosY = (GImGui->CurrentWindow->DC).CursorPos.y;
              local_1e8.ItemsCount = pIVar26->ElemCount / 3;
              local_1e8.StepNo = 0;
              local_1e8.ItemsHeight = -1.0;
              local_1e8.DisplayStart = -1;
              local_1e8.DisplayEnd = -1;
              local_180 = pIVar26;
              while (bVar14 = ImGuiListClipper::Step(&local_1e8), bVar14) {
                local_198._0_4_ = local_1e8.DisplayEnd;
                if (local_1e8.DisplayStart < local_1e8.DisplayEnd) {
                  uVar21 = (ulong)(uint)(local_1e8.DisplayStart * 3 + (int)local_1d0);
                  uVar17 = local_1e8.DisplayStart;
                  do {
                    local_1c0 = (ulong)uVar17;
                    local_1b8[0].x = 0.0;
                    local_1b8[0].y = 0.0;
                    local_1b8[1].x = 0.0;
                    local_1b8[1].y = 0.0;
                    local_1b8[2].x = 0.0;
                    local_1b8[2].y = 0.0;
                    lVar23 = 0;
                    buf_00 = local_168;
                    do {
                      lVar1 = (uVar21 & 0xffffffff) + lVar23;
                      if (puVar22 == (unsigned_short *)0x0) {
                        uVar17 = (uint)lVar1;
                      }
                      else {
                        uVar17 = (uint)puVar22[(int)uVar21 + lVar23];
                      }
                      if ((draw_list->VtxBuffer).Size <= (int)uVar17) goto LAB_001e858f;
                      pIVar12 = (draw_list->VtxBuffer).Data;
                      local_1b8[lVar23] = pIVar12[(int)uVar17].pos;
                      pcVar20 = "     ";
                      if (lVar23 == 0) {
                        pcVar20 = "Vert:";
                      }
                      iVar19 = ImFormatString((char *)buf_00,(size_t)(local_3c + -(long)buf_00),
                                              "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n"
                                              ,SUB84((double)pIVar12[(int)uVar17].pos.x,0),
                                              SUB84((double)pIVar12[(int)uVar17].pos.y,0),
                                              (double)pIVar12[(int)uVar17].uv.x,
                                              SUB84((double)pIVar12[(int)uVar17].uv.y,0),pcVar20,
                                              lVar1,(ulong)pIVar12[(int)uVar17].col);
                      buf_00 = (ImVec4 *)((long)&buf_00->x + (long)iVar19);
                      lVar23 = lVar23 + 1;
                    } while (lVar23 != 3);
                    local_170.x = 0.0;
                    local_170.y = 0.0;
                    Selectable((char *)local_168,false,0,&local_170);
                    pIVar25 = local_178;
                    bVar14 = IsItemHovered(0);
                    if (bVar14) {
                      uVar17 = (pIVar25->ForegroundDrawList).Flags;
                      (pIVar25->ForegroundDrawList).Flags = uVar17 & 0xfffffffe;
                      ImDrawList::AddPolyline(local_1c8,local_1b8,3,0xff00ffff,true,1.0);
                      (pIVar25->ForegroundDrawList).Flags = uVar17;
                    }
                    uVar21 = (uVar21 & 0xffffffff) + 3;
                    uVar17 = (int)local_1c0 + 1;
                  } while (uVar17 != local_198._0_4_);
                }
              }
              TreePop();
              pIVar26 = local_180;
              uVar21 = local_1d0;
              if ((float)local_1e8.ItemsCount != -NAN) {
                __assert_fail("ItemsCount == -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                              ,0x6d4,"ImGuiListClipper::~ImGuiListClipper()");
              }
            }
          }
        }
        else {
          BulletText("Callback %p, user_data %p",pIVar26->UserCallback,pIVar26->UserCallbackData);
        }
        uVar21 = (ulong)((int)uVar21 + pIVar26->ElemCount);
        pIVar26 = pIVar26 + 1;
      } while (pIVar26 < (draw_list->CmdBuffer).Data + (draw_list->CmdBuffer).Size);
    }
  }
  TreePop();
  return;
}

Assistant:

static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f,0.4f,0.4f,1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            if (window && !window->WasActive)
                ImGui::TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

            unsigned int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }

                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                char buf[300];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd: %4d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                    pcmd->ElemCount/3, (void*)(intptr_t)pcmd->TextureId,
                    pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
                if (show_drawcmd_details && fg_draw_list && ImGui::IsItemHovered())
                {
                    ImRect clip_rect = pcmd->ClipRect;
                    ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
                    for (unsigned int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                        vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                    fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255,0,255,255));
                    fg_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(255,255,0,255));
                }
                if (!pcmd_node_open)
                    continue;

                // Calculate approximate coverage area (touched pixel count)
                // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
                float total_area = 0.0f;
                for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + pcmd->ElemCount); base_idx += 3)
                {
                    ImVec2 triangle[3];
                    for (int n = 0; n < 3; n++)
                        triangle[n] = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
                }

                // Display vertex information summary. Hover to get all triangles drawn in wire-frame
                ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
                ImGui::Selectable(buf);
                if (fg_draw_list && ImGui::IsItemHovered() && show_drawcmd_details)
                {
                    // Draw wire-frame version of everything
                    ImDrawListFlags backup_flags = fg_draw_list->Flags;
                    fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                    ImRect clip_rect = pcmd->ClipRect;
                    fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255));
                    for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + pcmd->ElemCount); base_idx += 3)
                    {
                        ImVec2 triangle[3];
                        for (int n = 0; n < 3; n++)
                            triangle[n] = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                        fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f);
                    }
                    fg_draw_list->Flags = backup_flags;
                }

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangle[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                            triangle[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }

                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }